

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O0

void __thiscall
slang::ast::ForLoopStatement::serializeTo(ForLoopStatement *this,ASTSerializer *serializer)

{
  ASTSerializer *pAVar1;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  Expression *local_88;
  Expression *step;
  iterator __end2_1;
  iterator __begin2_1;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range2_1;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  Expression *local_48;
  Expression *ini;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range2;
  ASTSerializer *local_18;
  ASTSerializer *serializer_local;
  ForLoopStatement *this_local;
  
  local_18 = serializer;
  serializer_local = (ASTSerializer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&__range2,"initializers");
  ASTSerializer::startArray(serializer,___range2);
  __begin2 = (iterator)&this->initializers;
  __end2 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
           begin((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)__begin2);
  ini = (Expression *)
        nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
                  ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)__begin2);
  for (; (Expression *)__end2 != ini; __end2 = __end2 + 1) {
    local_48 = *__end2;
    ASTSerializer::serialize(local_18,local_48);
  }
  ASTSerializer::endArray(local_18);
  pAVar1 = local_18;
  if (this->stopExpr != (Expression *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,"stopExpr");
    ASTSerializer::write(pAVar1,(int)local_58._M_len,local_58._M_str,(size_t)this->stopExpr);
  }
  pAVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&__range2_1,"steps");
  ASTSerializer::startArray(pAVar1,___range2_1);
  __begin2_1 = (iterator)&this->steps;
  __end2_1 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
             begin((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)__begin2_1);
  step = (Expression *)
         nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
                   ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)__begin2_1)
  ;
  for (; (Expression *)__end2_1 != step; __end2_1 = __end2_1 + 1) {
    local_88 = *__end2_1;
    ASTSerializer::serialize(local_18,local_88);
  }
  ASTSerializer::endArray(local_18);
  pAVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_98,"body");
  ASTSerializer::write(pAVar1,(int)local_98._M_len,local_98._M_str,(size_t)this->body);
  return;
}

Assistant:

void ForLoopStatement::serializeTo(ASTSerializer& serializer) const {
    serializer.startArray("initializers");
    for (auto ini : initializers) {
        serializer.serialize(*ini);
    }
    serializer.endArray();

    if (stopExpr)
        serializer.write("stopExpr", *stopExpr);

    serializer.startArray("steps");
    for (auto step : steps) {
        serializer.serialize(*step);
    }
    serializer.endArray();

    serializer.write("body", body);
}